

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeZone.cc
# Opt level: O0

time_t __thiscall muduo::TimeZone::fromLocalTime(TimeZone *this,tm *localTm)

{
  Transition sentry_00;
  Localtime *seconds_00;
  void *in_RSI;
  tm tryTm;
  Localtime *local;
  Transition sentry;
  time_t seconds;
  tm tmp;
  Data *data;
  __shared_ptr_access<muduo::TimeZone::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff10;
  int local_cc;
  int local_c8;
  Data *in_stack_ffffffffffffff48;
  int local_b0;
  Comp in_stack_ffffffffffffff57;
  undefined1 in_stack_ffffffffffffff60 [16];
  TimeZone *in_stack_ffffffffffffff90;
  TimeZone *this_00;
  long local_58;
  tm local_50;
  element_type *local_18;
  void *local_10;
  
  local_10 = in_RSI;
  local_18 = std::
             __shared_ptr_access<muduo::TimeZone::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(in_stack_ffffffffffffff10);
  memcpy(&local_50,local_10,0x38);
  local_58 = timegm(&local_50);
  detail::Transition::Transition((Transition *)&stack0xffffffffffffff90,0,local_58,0);
  this_00 = in_stack_ffffffffffffff90;
  detail::Comp::Comp((Comp *)&stack0xffffffffffffff6f,false);
  sentry_00._16_8_ = in_stack_ffffffffffffff90;
  sentry_00.gmttime = in_stack_ffffffffffffff60._0_8_;
  sentry_00.localtime = in_stack_ffffffffffffff60._8_8_;
  seconds_00 = detail::findLocaltime(in_stack_ffffffffffffff48,sentry_00,in_stack_ffffffffffffff57);
  if ((((*(int *)((long)local_10 + 0x20) != 0) &&
       (toLocalTime(this_00,(time_t)seconds_00), local_b0 == 0)) &&
      (local_c8 == *(int *)((long)local_10 + 8))) && (local_cc == *(int *)((long)local_10 + 4))) {
    local_58 = local_58 + -0xe10;
  }
  return local_58 - seconds_00->gmtOffset;
}

Assistant:

time_t TimeZone::fromLocalTime(const struct tm& localTm) const
{
  assert(data_ != NULL);
  const Data& data(*data_);

  struct tm tmp = localTm;
  time_t seconds = ::timegm(&tmp); // FIXME: toUtcTime
  detail::Transition sentry(0, seconds, 0);
  const detail::Localtime* local = findLocaltime(data, sentry, detail::Comp(false));
  if (localTm.tm_isdst)
  {
    struct tm tryTm = toLocalTime(seconds - local->gmtOffset);
    if (!tryTm.tm_isdst
        && tryTm.tm_hour == localTm.tm_hour
        && tryTm.tm_min == localTm.tm_min)
    {
      // FIXME: HACK
      seconds -= 3600;
    }
  }
  return seconds - local->gmtOffset;
}